

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPrimvarReader_float2 *shader,
          uint32_t indent)

{
  pointer pPVar1;
  uint32_t indent_00;
  uint32_t in_R8D;
  string local_2a0;
  allocator local_279;
  undefined1 local_278 [32];
  string local_258;
  allocator local_231;
  undefined1 local_230 [32];
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  pointer pPStack_18;
  uint32_t indent_local;
  UsdPrimvarReader_float2 *shader_local;
  
  local_1c = (uint32_t)shader;
  pPStack_18 = (pointer)this;
  shader_local = (UsdPrimvarReader_float2 *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pPVar1 = pPStack_18 + 0xb;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e8,"inputs:varname",&local_1e9);
  print_str_attr(&local_1c8,
                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(pPVar1->_element)._M_string_length,&local_1e8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pPVar1 = pPStack_18 + 8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_230,"inputs:fallback",&local_231);
  print_typed_attr<std::array<float,2ul>>
            ((string *)(local_230 + 0x20),(tinyusdz *)(pPVar1->_element).field_2._M_local_buf,
             (TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_230,
             (string *)(ulong)local_1c,in_R8D);
  ::std::operator<<(aoStack_198,(string *)(local_230 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_230 + 0x20));
  ::std::__cxx11::string::~string((string *)local_230);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pPVar1 = pPStack_18 + 0xe;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_278,"outputs:result",&local_279);
  indent_00 = local_1c;
  print_typed_terminal_attr<std::array<float,2ul>>
            ((string *)(local_278 + 0x20),(tinyusdz *)((pPVar1->_element).field_2._M_local_buf + 8),
             (TypedTerminalAttribute<std::array<float,_2UL>_> *)local_278,(string *)(ulong)local_1c,
             in_R8D);
  ::std::operator<<(aoStack_198,(string *)(local_278 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_278 + 0x20));
  ::std::__cxx11::string::~string((string *)local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  print_common_shader_params_abi_cxx11_
            (&local_2a0,(tinyusdz *)pPStack_18,(ShaderNode *)(ulong)local_1c,indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_shader_params(const UsdPrimvarReader_float2 &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_str_attr(shader.varname, "inputs:varname", indent);
  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);
  ss << print_typed_terminal_attr(shader.result, "outputs:result", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}